

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O2

byte __thiscall TTD::TextFormatReader::ReadNakedByte(TextFormatReader *this,bool readSeparator)

{
  ParseTokenKind PVar1;
  uint64 uVar2;
  undefined7 in_register_00000031;
  TextFormatReader *this_00;
  
  (*(this->super_FileReader)._vptr_FileReader[2])(this,CONCAT71(in_register_00000031,readSeparator))
  ;
  this_00 = this;
  PVar1 = Scan(this,&this->m_charListOpt);
  if (PVar1 == Number) {
    uVar2 = ReadUIntFromCharArray
                      (this_00,(this->m_charListOpt).
                               super_ReadOnlyList<char16_t,_Memory::HeapAllocator,_DefaultComparer>.
                               buffer);
    if (uVar2 < 0x100) {
      return (byte)uVar2;
    }
  }
  TTDAbort_unrecoverable_error("Error in parse.");
}

Assistant:

byte TextFormatReader::ReadNakedByte(bool readSeparator)
    {
        this->ReadSeparator(readSeparator);

        NSTokens::ParseTokenKind tok = this->Scan(this->m_charListOpt);
        TTDAssert(tok == NSTokens::ParseTokenKind::Number, "Error in parse.");

        uint64 uval = this->ReadUIntFromCharArray(this->m_charListOpt.GetBuffer());
        TTDAssert(uval <= BYTE_MAX, "Error in parse.");

        return (byte)uval;
    }